

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.cxx
# Opt level: O3

bool __thiscall
cmCTestRunScriptCommand::InitialPass
          (cmCTestRunScriptCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  pointer pbVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  pointer pbVar10;
  uint uVar11;
  uint __len;
  string_view value;
  int ret;
  string returnVariable;
  uint local_7c;
  long *local_78;
  size_t local_70;
  long local_68 [2];
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar10 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    cmCTestScriptHandler::RunCurrentScript((this->super_cmCTestCommand).CTestScriptHandler);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)pbVar10);
    uVar9 = (ulong)(iVar1 == 0);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5;
    uVar6 = uVar9;
    if (uVar9 < uVar4) {
      do {
        uVar7 = (uint)uVar6;
        iVar2 = std::__cxx11::string::compare((char *)(pbVar10 + uVar6));
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if ((iVar2 == 0) &&
           (uVar7 = uVar7 + 1, (ulong)uVar7 < (ulong)((long)pbVar5 - (long)pbVar10 >> 5))) {
          std::__cxx11::string::_M_assign((string *)&local_58);
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar5 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar4 = (long)pbVar5 - (long)pbVar10 >> 5;
        uVar6 = (ulong)(uVar7 + 1);
      } while (uVar7 + 1 < uVar4);
    }
    if (uVar9 < uVar4) {
      local_38 = args;
      do {
        iVar8 = (int)uVar9;
        iVar2 = std::__cxx11::string::compare((char *)(pbVar10 + uVar9));
        if (iVar2 == 0) {
          iVar8 = iVar8 + 1;
        }
        else {
          cmCTestScriptHandler::RunScript
                    ((this->super_cmCTestCommand).CTest,
                     (this->super_cmCTestCommand).super_cmCommand.Makefile,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar9,iVar1 != 0,(int *)&local_7c)
          ;
          uVar7 = -local_7c;
          if (0 < (int)local_7c) {
            uVar7 = local_7c;
          }
          __len = 1;
          if (9 < uVar7) {
            uVar6 = (ulong)uVar7;
            uVar11 = 4;
            do {
              __len = uVar11;
              uVar3 = (uint)uVar6;
              if (uVar3 < 100) {
                __len = __len - 2;
                goto LAB_005b9e25;
              }
              if (uVar3 < 1000) {
                __len = __len - 1;
                goto LAB_005b9e25;
              }
              if (uVar3 < 10000) goto LAB_005b9e25;
              uVar6 = uVar6 / 10000;
              uVar11 = __len + 4;
            } while (99999 < uVar3);
            __len = __len + 1;
          }
LAB_005b9e25:
          this_00 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
          uVar11 = local_7c >> 0x1f;
          local_78 = local_68;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_78,(char)__len - (char)((int)local_7c >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)local_78 + (ulong)uVar11),__len,uVar7);
          value._M_str = (char *)local_78;
          value._M_len = local_70;
          cmMakefile::AddDefinition(this_00,&local_58,value);
          args = local_38;
          if (local_78 != local_68) {
            operator_delete(local_78,local_68[0] + 1);
            args = local_38;
          }
        }
        uVar9 = (ulong)(iVar8 + 1);
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar9 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >>
                              5));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  return true;
}

Assistant:

bool cmCTestRunScriptCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->CTestScriptHandler->RunCurrentScript();
    return true;
  }

  bool np = false;
  unsigned int i = 0;
  if (args[i] == "NEW_PROCESS") {
    np = true;
    i++;
  }
  int start = i;
  // run each script
  std::string returnVariable;
  for (i = start; i < args.size(); ++i) {
    if (args[i] == "RETURN_VALUE") {
      ++i;
      if (i < args.size()) {
        returnVariable = args[i];
      }
    }
  }
  for (i = start; i < args.size(); ++i) {
    if (args[i] == "RETURN_VALUE") {
      ++i;
    } else {
      int ret;
      cmCTestScriptHandler::RunScript(this->CTest, this->Makefile, args[i],
                                      !np, &ret);
      this->Makefile->AddDefinition(returnVariable, std::to_string(ret));
    }
  }
  return true;
}